

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O0

char * raccess_make_file_name(FT_Memory memory,char *original_name,char *insertion)

{
  size_t sVar1;
  size_t sVar2;
  int local_4c;
  long lStack_48;
  FT_Error error;
  size_t new_length;
  char *slash;
  char *tmp;
  char *new_name;
  char *insertion_local;
  char *original_name_local;
  FT_Memory memory_local;
  
  tmp = (char *)0x0;
  new_name = insertion;
  insertion_local = original_name;
  original_name_local = (char *)memory;
  sVar1 = strlen(original_name);
  sVar2 = strlen(new_name);
  lStack_48 = sVar1 + sVar2;
  tmp = (char *)ft_mem_qalloc((FT_Memory)original_name_local,lStack_48 + 1,&local_4c);
  if (local_4c == 0) {
    slash = strrchr(insertion_local,0x2f);
    if (slash == (char *)0x0) {
      new_length = (size_t)insertion_local;
      *tmp = '\0';
    }
    else {
      strncpy(tmp,insertion_local,(size_t)(slash + (1 - (long)insertion_local)));
      tmp[(long)(slash + (1 - (long)insertion_local))] = '\0';
      new_length = (size_t)(slash + 1);
    }
    strcat(tmp,new_name);
    strcat(tmp,(char *)new_length);
    memory_local = (FT_Memory)tmp;
  }
  else {
    memory_local = (FT_Memory)0x0;
  }
  return (char *)memory_local;
}

Assistant:

static char*
  raccess_make_file_name( FT_Memory    memory,
                          const char  *original_name,
                          const char  *insertion )
  {
    char*        new_name = NULL;
    const char*  tmp;
    const char*  slash;
    size_t       new_length;
    FT_Error     error;


    new_length = ft_strlen( original_name ) + ft_strlen( insertion );
    if ( FT_QALLOC( new_name, new_length + 1 ) )
      return NULL;

    tmp = ft_strrchr( original_name, '/' );
    if ( tmp )
    {
      ft_strncpy( new_name,
                  original_name,
                  (size_t)( tmp - original_name + 1 ) );
      new_name[tmp - original_name + 1] = '\0';
      slash = tmp + 1;
    }
    else
    {
      slash       = original_name;
      new_name[0] = '\0';
    }

    ft_strcat( new_name, insertion );
    ft_strcat( new_name, slash );

    return new_name;
  }